

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*,_char_*,_char[4608],_char_*>
* __thiscall
fmt::v9::
make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*const&,char*&,char*&,char(&)[4608],char*&>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*,_char_*,_char[4608],_char_*>
           *__return_storage_ptr__,v9 *this,char **args,char **args_1,char **args_2,
          char (*args_3) [4608],char **args_4)

{
  char *pcVar1;
  char *pcVar2;
  longlong lVar3;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  bool formattable_4;
  bool formattable_pointer_4;
  bool formattable_const_4;
  bool formattable_char_4;
  char_type **arg_4;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  char_type **arg_3;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  size_t local_200;
  size_t local_1c0;
  size_t local_180;
  size_t local_110;
  char **args_local_4;
  char (*args_local_3) [4608];
  char **args_local_2;
  char **args_local_1;
  char **args_local;
  size_t local_30;
  
  pcVar1 = *args;
  pcVar2 = *args_1;
  lVar3 = *(longlong *)*args_3;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_30;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = pcVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_200;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = pcVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_1c0;
  (__return_storage_ptr__->data_).args_[3].field_0.pointer = args_2;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_110;
  (__return_storage_ptr__->data_).args_[4].field_0.long_long_value = lVar3;
  (__return_storage_ptr__->data_).args_[4].field_0.string.size = local_180;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}